

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O2

string * __thiscall
pbrt::SurfaceInteraction::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceInteraction *this)

{
  ulong uVar1;
  MediumInterface *this_00;
  ulong uVar2;
  ulong uVar3;
  int *in_stack_fffffffffffffeb0;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  uVar1 = (this->super_Interaction).medium.
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  local_b8 = "(nullptr)";
  if ((uVar1 & 0xffffffffffff) != 0) {
    in_stack_fffffffffffffeb0 = (int *)0x3029d2;
    MediumHandle::ToString_abi_cxx11_(&local_50,&(this->super_Interaction).medium);
    local_b8 = local_50._M_dataplus._M_p;
  }
  this_00 = (this->super_Interaction).mediumInterface;
  local_c0 = "(nullptr)";
  if (this_00 != (MediumInterface *)0x0) {
    in_stack_fffffffffffffeb0 = (int *)0x302a08;
    MediumInterface::ToString_abi_cxx11_(&local_70,this_00);
    local_c0 = local_70._M_dataplus._M_p;
  }
  uVar2 = (this->material).
          super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          .bits;
  local_c8 = "(nullptr)";
  if ((uVar2 & 0xffffffffffff) != 0) {
    in_stack_fffffffffffffeb0 = (int *)0x302a40;
    MaterialHandle::ToString_abi_cxx11_(&local_90,&this->material);
    local_c8 = local_90._M_dataplus._M_p;
  }
  uVar3 = (this->areaLight).
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          .bits;
  local_d0 = "(nullptr)";
  if ((uVar3 & 0xffffffffffff) != 0) {
    in_stack_fffffffffffffeb0 = (int *)0x302a7a;
    LightHandle::ToString_abi_cxx11_(&local_b0,&this->areaLight);
    local_d0 = local_b0._M_dataplus._M_p;
  }
  StringPrintf<pbrt::Point3fi_const&,pbrt::Normal3<float>const&,pbrt::Point2<float>const&,pbrt::Vector3<float>const&,float_const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,pbrt::Normal3<float>const&,pbrt::Normal3<float>const&,char_const*,char_const*,pbrt::Vector3<float>const&,pbrt::Vector3<float>const&,float_const&,float_const&,float_const&,float_const&,int_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ SurfaceInteraction pi: %s n: %s uv: %s wo: %s time: %s medium: %s mediumInterface: %s dpdu: %s dpdv: %s dndu: %s dndv: %s shading.n: %s shading.dpdu: %s shading.dpdv: %s shading.dndu: %s shading.dndv: %s material: %s areaLight: %s dpdx: %s dpdy: %s dudx: %f dvdx: %f dudy: %f dvdy: %f faceIndex: %d ]"
             ,(char *)this,(Point3fi *)&(this->super_Interaction).n,
             (Normal3<float> *)&(this->super_Interaction).uv,
             (Point2<float> *)&(this->super_Interaction).wo,
             (Vector3<float> *)&(this->super_Interaction).time,(float *)&local_b8,&local_c0,
             (char **)&this->dpdu,&this->dpdv,(Vector3<float> *)&this->dndu,&this->dndv,
             &(this->shading).n,(Normal3<float> *)&(this->shading).dpdu,&(this->shading).dpdv,
             (Vector3<float> *)&(this->shading).dndu,&(this->shading).dndv,
             (Normal3<float> *)&local_c8,&local_d0,(char **)&this->dpdx,&this->dpdy,
             (Vector3<float> *)&this->dudx,&this->dvdx,&this->dudy,&this->dvdy,
             (float *)&this->faceIndex,in_stack_fffffffffffffeb0);
  if ((uVar3 & 0xffffffffffff) != 0) {
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if ((uVar2 & 0xffffffffffff) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if (this_00 != (MediumInterface *)0x0) {
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((uVar1 & 0xffffffffffff) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SurfaceInteraction::ToString() const {
    return StringPrintf(
        "[ SurfaceInteraction pi: %s n: %s uv: %s wo: %s time: %s "
        "medium: %s mediumInterface: %s dpdu: %s dpdv: %s dndu: %s dndv: %s "
        "shading.n: %s shading.dpdu: %s shading.dpdv: %s "
        "shading.dndu: %s shading.dndv: %s material: %s "
        "areaLight: %s dpdx: %s dpdy: %s dudx: %f dvdx: %f "
        "dudy: %f dvdy: %f faceIndex: %d ]",
        pi, n, uv, wo, time, medium ? medium.ToString().c_str() : "(nullptr)",
        mediumInterface ? mediumInterface->ToString().c_str() : "(nullptr)", dpdu, dpdv,
        dndu, dndv, shading.n, shading.dpdu, shading.dpdv, shading.dndu, shading.dndv,
        material ? material.ToString().c_str() : "(nullptr)",
        areaLight ? areaLight.ToString().c_str() : "(nullptr)", dpdx, dpdy, dudx, dvdx,
        dudy, dvdy, faceIndex);
}